

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

float rsg::VariableRead::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  Storage SVar1;
  VariableManager *pVVar2;
  pointer ppVVar3;
  bool bVar4;
  pointer ppVVar5;
  float fVar6;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  IsReadableIntersectingEntry local_38;
  
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    pVVar2 = state->m_varManager;
    ppVVar5 = (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar3 = (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppVVar5 == ppVVar3) ||
       (((state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1] & 1) == 0)) {
      if (ppVVar5 == ppVVar3) goto LAB_00140254;
    }
    else {
      SVar1 = (*ppVVar5)->m_variable->m_storage;
      while( true ) {
        if (SVar1 == STORAGE_CONST) {
          return 0.05;
        }
        ppVVar5 = ppVVar5 + 1;
        if (ppVVar5 == ppVVar3) break;
        SVar1 = (*ppVVar5)->m_variable->m_storage;
      }
LAB_00140254:
      if (state->m_shaderParams->maxCombinedVariableScalars <= pVVar2->m_numAllocatedScalars)
      goto LAB_0014026a;
    }
    fVar6 = 0.05;
  }
  else {
    bVar4 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
    if (bVar4) {
      return 1.0;
    }
    pVVar2 = state->m_varManager;
    local_38.super_IsReadableEntry.m_exprFlags =
         (state->m_exprFlagStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
    local_50 = valueRange.m_type._0_4_;
    uStack_4c = valueRange.m_type._4_4_;
    uStack_48 = valueRange.m_min._0_4_;
    local_38.m_valueRange.m_min._4_4_ = valueRange.m_min._4_4_;
    local_38.m_valueRange.m_max = valueRange.m_max;
    local_38.m_valueRange.m_type._0_4_ = local_50;
    local_38._4_4_ = uStack_54;
    local_38.m_valueRange.m_type._4_4_ = uStack_4c;
    local_38.m_valueRange.m_min._0_4_ = uStack_48;
    ppVVar5 = (pVVar2->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppVVar5 !=
        (pVVar2->m_entryCache).
        super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar4 = anon_unknown_0::IsReadableIntersectingEntry::operator()(&local_38,*ppVVar5);
        if (bVar4) {
          return 1.0;
        }
        ppVVar5 = ppVVar5 + 1;
      } while (ppVVar5 !=
               (pVVar2->m_entryCache).
               super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_0014026a:
    fVar6 = 0.0;
  }
  return fVar6;
}

Assistant:

float VariableRead::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
	{
		if (state.getVariableManager().hasEntry(IsReadableEntry(state.getExpressionFlags())) ||
			state.getVariableManager().getNumAllocatedScalars() < state.getShaderParameters().maxCombinedVariableScalars)
			return unusedValueWeight;
		else
			return 0.0f;
	}

	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags())))
		return 0.0f;
	else
		return 1.0f;
}